

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall antlr::Parser::traceOut(Parser *this,char *rname)

{
  long *plVar1;
  size_t sVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  TokenRefCount<antlr::Token> local_50;
  long *local_48 [2];
  long local_38 [2];
  
  if (0 < this->traceDepth) {
    iVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->traceDepth);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"< ",2);
  if (rname == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x311428);
  }
  else {
    sVar2 = strlen(rname);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,rname,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"; LA(1)==",9);
  (*this->_vptr_Parser[3])(&local_50,this,1);
  (*(local_50.ref)->ptr->_vptr_Token[4])(local_48);
  plVar1 = local_48[0];
  if (local_48[0] == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x311428);
  }
  else {
    sVar2 = strlen((char *)local_48[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)plVar1,sVar2);
  }
  iVar4 = ((this->inputState).ref)->ptr->guessing;
  pcVar5 = "";
  if (0 < iVar4) {
    pcVar5 = " [guessing]";
  }
  lVar3 = 0xb;
  if (iVar4 < 1) {
    lVar3 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  TokenRefCount<antlr::Token>::~TokenRefCount(&local_50);
  this->traceDepth = this->traceDepth + -1;
  return;
}

Assistant:

void Parser::traceOut(const char* rname)
{
	for( int i = 0; i < traceDepth; i++ )
		ANTLR_USE_NAMESPACE(std)cout << " ";

	ANTLR_USE_NAMESPACE(std)cout << "< " << rname
		<< "; LA(1)==" << LT(1)->getText().c_str()
		<<	((inputState->guessing>0)?" [guessing]":"")
		<< ANTLR_USE_NAMESPACE(std)endl;

	traceDepth--;
}